

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

void create_polymon(obj *obj,int okind)

{
  int iVar1;
  monst *mtmp_00;
  char *pcVar2;
  int local_34;
  char *pcStack_30;
  int pm_index;
  char *material;
  monst *mtmp;
  permonst *mdat;
  int okind_local;
  obj *obj_local;
  
  mtmp = (monst *)0x0;
  if ((obj != (obj *)0x0) && (((obj->v).v_nexthere != (obj *)0x0 || (obj->quan != 1)))) {
    switch(okind) {
    case 0:
    case 4:
      local_34 = 0x106;
      pcStack_30 = "organic ";
      break;
    default:
      local_34 = 0xff;
      pcStack_30 = "";
      break;
    case 2:
      local_34 = 0x101;
      pcStack_30 = "wax ";
      break;
    case 5:
      local_34 = 0x100;
      pcStack_30 = "paper ";
      break;
    case 6:
      local_34 = 0x102;
      pcStack_30 = "cloth ";
      break;
    case 7:
      local_34 = 0x104;
      pcStack_30 = "leather ";
      break;
    case 8:
      local_34 = 0x105;
      pcStack_30 = "wood ";
      break;
    case 9:
      local_34 = 0xfe;
      pcStack_30 = "bony ";
      break;
    case 0xb:
    case 0xc:
    case 0x11:
      local_34 = 0x10a;
      pcStack_30 = "metal ";
      break;
    case 0xd:
    case 0xe:
    case 0x10:
    case 0x14:
    case 0x15:
      iVar1 = rn2(2);
      local_34 = 0x107;
      if (iVar1 != 0) {
        local_34 = 0x108;
      }
      pcStack_30 = "lithic ";
      break;
    case 0xf:
      local_34 = 0x103;
      pcStack_30 = "gold ";
      break;
    case 0x13:
      local_34 = 0x109;
      pcStack_30 = "glassy ";
    }
    if ((mvitals[local_34].mvflags & 2) == 0) {
      mtmp = (monst *)(mons + local_34);
    }
    mtmp_00 = makemon((permonst *)mtmp,level,(int)obj->ox,(int)obj->oy,0);
    polyuse(obj,okind,(uint)mons[local_34].cwt);
    if ((mtmp_00 != (monst *)0x0) && ((viz_array[mtmp_00->my][mtmp_00->mx] & 2U) != 0)) {
      pcVar2 = a_monnam(mtmp_00);
      pline("Some %sobjects meld, and %s arises from the pile!",pcStack_30,pcVar2);
    }
  }
  return;
}

Assistant:

static void create_polymon(struct obj *obj, int okind)
{
	const struct permonst *mdat = NULL;
	struct monst *mtmp;
	const char *material;
	int pm_index;

	/* no golems if you zap only one object -- not enough stuff */
	if (!obj || (!obj->nexthere && obj->quan == 1L)) return;

	/* some of these choices are arbitrary */
	switch(okind) {
	case IRON:
	case METAL:
	case MITHRIL:
	    pm_index = PM_IRON_GOLEM;
	    material = "metal ";
	    break;
	case COPPER:
	case SILVER:
	case PLATINUM:
	case GEMSTONE:
	case MINERAL:
	    pm_index = rn2(2) ? PM_STONE_GOLEM : PM_CLAY_GOLEM;
	    material = "lithic ";
	    break;
	case 0:
	case FLESH:
	    /* there is no flesh type, but all food is type 0, so we use it */
	    pm_index = PM_FLESH_GOLEM;
	    material = "organic ";
	    break;
	case WAX:
	    pm_index = PM_WAX_GOLEM;
	    material = "wax ";
	    break;
	case WOOD:
	    pm_index = PM_WOOD_GOLEM;
	    material = "wood ";
	    break;
	case LEATHER:
	    pm_index = PM_LEATHER_GOLEM;
	    material = "leather ";
	    break;
	case CLOTH:
	    pm_index = PM_ROPE_GOLEM;
	    material = "cloth ";
	    break;
	case BONE:
	    pm_index = PM_SKELETON;     /* nearest thing to "bone golem" */
	    material = "bony ";
	    break;
	case GOLD:
	    pm_index = PM_GOLD_GOLEM;
	    material = "gold ";
	    break;
	case GLASS:
	    pm_index = PM_GLASS_GOLEM;
	    material = "glassy ";
	    break;
	case PAPER:
	    pm_index = PM_PAPER_GOLEM;
	    material = "paper ";
	    break;
	default:
	    /* if all else fails... */
	    pm_index = PM_STRAW_GOLEM;
	    material = "";
	    break;
	}

	if (!(mvitals[pm_index].mvflags & G_GENOD))
		mdat = &mons[pm_index];

	mtmp = makemon(mdat, level, obj->ox, obj->oy, NO_MM_FLAGS);
	polyuse(obj, okind, (int)mons[pm_index].cwt);

	if (mtmp && cansee(mtmp->mx, mtmp->my)) {
	    pline("Some %sobjects meld, and %s arises from the pile!",
		  material, a_monnam(mtmp));
	}
}